

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void icu_63::MessageImpl::appendReducedApostrophes
               (UnicodeString *s,int32_t start,int32_t limit,UnicodeString *sb)

{
  int32_t iVar1;
  int local_24;
  int32_t i;
  int32_t doubleApos;
  UnicodeString *sb_local;
  int32_t limit_local;
  int32_t start_local;
  UnicodeString *s_local;
  
  local_24 = -1;
  sb_local._4_4_ = start;
  while ((iVar1 = UnicodeString::indexOf(s,L'\'',sb_local._4_4_), -1 < iVar1 && (iVar1 < limit))) {
    if (iVar1 == local_24) {
      UnicodeString::append(sb,L'\'');
      sb_local._4_4_ = sb_local._4_4_ + 1;
      local_24 = -1;
    }
    else {
      UnicodeString::append(sb,s,sb_local._4_4_,iVar1 - sb_local._4_4_);
      local_24 = iVar1 + 1;
      sb_local._4_4_ = local_24;
    }
  }
  UnicodeString::append(sb,s,sb_local._4_4_,limit - sb_local._4_4_);
  return;
}

Assistant:

void
MessageImpl::appendReducedApostrophes(const UnicodeString &s, int32_t start, int32_t limit,
                                      UnicodeString &sb) {
    int32_t doubleApos=-1;
    for(;;) {
        int32_t i=s.indexOf(u_apos, start);
        if(i<0 || i>=limit) {
            sb.append(s, start, limit-start);
            break;
        }
        if(i==doubleApos) {
            // Double apostrophe at start-1 and start==i, append one.
            sb.append(u_apos);
            ++start;
            doubleApos=-1;
        } else {
            // Append text between apostrophes and skip this one.
            sb.append(s, start, i-start);
            doubleApos=start=i+1;
        }
    }
}